

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O1

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::SplitMesh
          (SplitLargeMeshesProcess_Triangle *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  aiFace *paVar1;
  aiColor4D *paVar2;
  pointer *pppVar3;
  aiBone *paVar4;
  aiVertexWeight aVar5;
  uint *puVar6;
  aiVector3D *paVar7;
  iterator iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  pointer __src;
  uint uVar24;
  uint uVar25;
  Logger *this_00;
  aiMesh *paVar26;
  ulong *puVar27;
  aiFace *paVar28;
  aiVector3D *paVar29;
  void *__s;
  aiColor4D *paVar30;
  aiBone **ppaVar31;
  aiBone *paVar32;
  aiVertexWeight *paVar33;
  uint *puVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> avTempWeights;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> local_498;
  uint local_480;
  uint local_47c;
  char *local_478;
  ulong local_470;
  int local_468;
  uint local_464;
  ulong local_460;
  aiVector3D **local_458;
  char *local_450;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_448
  ;
  aiBone ***local_440;
  pair<aiMesh_*,_unsigned_int> local_438 [64];
  
  if (this->LIMIT < pMesh->mNumFaces) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Mesh exceeds the triangle limit. It will be split ...");
    local_460 = (ulong)pMesh->mNumFaces / (ulong)this->LIMIT;
    local_47c = (int)local_460 + 1;
    uVar35 = pMesh->mNumFaces / local_47c;
    local_450 = (pMesh->mName).data;
    local_468 = (int)local_460 * uVar35;
    local_480 = 0;
    uVar25 = 0;
    local_464 = a;
    local_448 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                 *)avList;
    do {
      paVar26 = (aiMesh *)operator_new(0x520);
      paVar26->mPrimitiveTypes = 0;
      paVar26->mNumVertices = 0;
      paVar26->mNumFaces = 0;
      local_458 = &paVar26->mVertices;
      memset(local_458,0,0xcc);
      paVar26->mBones = (aiBone **)0x0;
      paVar26->mMaterialIndex = 0;
      (paVar26->mName).length = 0;
      (paVar26->mName).data[0] = '\0';
      memset((paVar26->mName).data + 1,0x1b,0x3ff);
      paVar26->mNumAnimMeshes = 0;
      paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar26->mMethod = 0;
      (paVar26->mAABB).mMin.x = 0.0;
      (paVar26->mAABB).mMin.y = 0.0;
      (paVar26->mAABB).mMin.z = 0.0;
      (paVar26->mAABB).mMax.x = 0.0;
      (paVar26->mAABB).mMax.y = 0.0;
      (paVar26->mAABB).mMax.z = 0.0;
      paVar26->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar26->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar26->mNumUVComponents[0] = 0;
      paVar26->mNumUVComponents[1] = 0;
      paVar26->mNumUVComponents[2] = 0;
      paVar26->mNumUVComponents[3] = 0;
      paVar26->mNumUVComponents[4] = 0;
      paVar26->mNumUVComponents[5] = 0;
      paVar26->mNumUVComponents[6] = 0;
      paVar26->mNumUVComponents[7] = 0;
      paVar26->mColors[0] = (aiColor4D *)0x0;
      paVar26->mColors[1] = (aiColor4D *)0x0;
      paVar26->mColors[2] = (aiColor4D *)0x0;
      paVar26->mColors[3] = (aiColor4D *)0x0;
      paVar26->mColors[4] = (aiColor4D *)0x0;
      paVar26->mColors[5] = (aiColor4D *)0x0;
      paVar26->mColors[6] = (aiColor4D *)0x0;
      paVar26->mColors[7] = (aiColor4D *)0x0;
      paVar26->mNumFaces = uVar35;
      paVar26->mMaterialIndex = pMesh->mMaterialIndex;
      if (paVar26 != pMesh) {
        uVar39 = (pMesh->mName).length;
        (paVar26->mName).length = uVar39;
        memcpy((paVar26->mName).data,local_450,(ulong)uVar39);
        (paVar26->mName).data[uVar39] = '\0';
      }
      if (uVar25 == (uint)local_460) {
        paVar26->mNumFaces = pMesh->mNumFaces - local_468;
      }
      uVar39 = paVar26->mNumFaces;
      uVar41 = (ulong)uVar39;
      puVar27 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar27 + 1);
      *puVar27 = uVar41;
      if (uVar41 != 0) {
        paVar28 = paVar1;
        do {
          paVar28->mNumIndices = 0;
          paVar28->mIndices = (uint *)0x0;
          paVar28 = paVar28 + 1;
        } while (paVar28 != paVar1 + uVar41);
      }
      paVar26->mFaces = paVar1;
      uVar36 = uVar25 * uVar35;
      local_470 = (ulong)uVar36;
      uVar41 = 0;
      if (uVar36 < uVar39 + uVar36) {
        uVar37 = (ulong)local_480;
        uVar41 = 0;
        do {
          uVar41 = (ulong)((int)uVar41 + pMesh->mFaces[uVar37].mNumIndices);
          uVar37 = uVar37 + 1;
        } while ((int)uVar37 != uVar39 + local_480);
      }
      uVar39 = (uint)uVar41;
      paVar26->mNumVertices = uVar39;
      if (pMesh->mVertices != (aiVector3D *)0x0) {
        paVar29 = (aiVector3D *)operator_new__(uVar41 * 0xc);
        if (uVar39 != 0) {
          memset(paVar29,0,((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        *local_458 = paVar29;
      }
      uVar36 = pMesh->mNumVertices;
      if (uVar36 != 0 && pMesh->mNormals != (aiVector3D *)0x0) {
        paVar29 = (aiVector3D *)operator_new__(uVar41 * 0xc);
        if (uVar39 != 0) {
          memset(paVar29,0,((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar26->mNormals = paVar29;
      }
      if ((pMesh->mBitangents != (aiVector3D *)0x0 && pMesh->mTangents != (aiVector3D *)0x0) &&
          uVar36 != 0) {
        paVar29 = (aiVector3D *)operator_new__(uVar41 * 0xc);
        if (uVar39 != 0) {
          memset(paVar29,0,((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar26->mTangents = paVar29;
        paVar29 = (aiVector3D *)operator_new__(uVar41 * 0xc);
        if (uVar39 != 0) {
          memset(paVar29,0,((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar26->mBitangents = paVar29;
      }
      local_440 = &paVar26->mBones;
      local_478 = (char *)(((uVar41 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      lVar40 = 0;
      do {
        *(undefined4 *)((long)paVar26->mNumUVComponents + lVar40) =
             *(undefined4 *)((long)pMesh->mNumUVComponents + lVar40);
        if (*(long *)((long)pMesh->mTextureCoords + lVar40 * 2) != 0 && uVar36 != 0) {
          __s = operator_new__(uVar41 * 0xc);
          if (uVar39 != 0) {
            memset(__s,0,(size_t)local_478);
          }
          *(void **)((long)paVar26->mTextureCoords + lVar40 * 2) = __s;
        }
        lVar40 = lVar40 + 4;
      } while (lVar40 != 0x20);
      lVar40 = 6;
      do {
        if (pMesh->mColors[lVar40 + -6] != (aiColor4D *)0x0 && uVar36 != 0) {
          paVar30 = (aiColor4D *)operator_new__(uVar41 << 4);
          if (uVar39 != 0) {
            memset(paVar30,0,uVar41 << 4);
          }
          paVar26->mColors[lVar40 + -6] = paVar30;
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0xe);
      if (pMesh->mBones != (aiBone **)0x0 && pMesh->mNumBones != 0) {
        ppaVar31 = (aiBone **)operator_new__((ulong)pMesh->mNumBones << 3);
        paVar26->mBones = ppaVar31;
        local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_start = (aiVertexWeight *)0x0;
        local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_finish = (aiVertexWeight *)0x0;
        local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (aiVertexWeight *)0x0;
        if (paVar26->mNumBones != 0) {
          uVar41 = 0;
          do {
            paVar4 = (*local_440)[uVar41];
            if (local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                      (&local_498,(ulong)paVar4->mNumWeights / (ulong)local_47c);
            if (paVar4->mNumWeights != 0) {
              lVar40 = 0;
              uVar37 = 0;
              do {
                uVar39 = *(uint *)((long)&paVar4->mWeights->mVertexId + lVar40);
                if (((uint)local_470 <= uVar39) && (uVar39 < (uVar25 + 3) * uVar35)) {
                  paVar33 = (aiVertexWeight *)((long)&paVar4->mWeights->mVertexId + lVar40);
                  if (local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                    _M_realloc_insert<aiVertexWeight_const&>
                              ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)&local_498,
                               (iterator)
                               local_498.
                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                               _M_impl.super__Vector_impl_data._M_finish,paVar33);
                  }
                  else {
                    *local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                     _M_impl.super__Vector_impl_data._M_finish = *paVar33;
                    local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_498.
                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl
                         .super__Vector_impl_data._M_finish + 1;
                  }
                  aVar5 = local_498.
                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1];
                  *paVar33 = aVar5;
                  paVar33->mVertexId = aVar5.mVertexId - (uint)local_470;
                }
                uVar37 = uVar37 + 1;
                lVar40 = lVar40 + 8;
              } while (uVar37 < paVar4->mNumWeights);
            }
            if (local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              paVar32 = (aiBone *)operator_new(0x460);
              (paVar32->mName).length = 0;
              local_478 = (paVar32->mName).data;
              (paVar32->mName).data[0] = '\0';
              memset((paVar32->mName).data + 1,0x1b,0x3ff);
              paVar32->mNumWeights = 0;
              paVar32->mWeights = (aiVertexWeight *)0x0;
              (paVar32->mOffsetMatrix).a1 = 1.0;
              (paVar32->mOffsetMatrix).a2 = 0.0;
              (paVar32->mOffsetMatrix).a3 = 0.0;
              (paVar32->mOffsetMatrix).a4 = 0.0;
              (paVar32->mOffsetMatrix).b1 = 0.0;
              (paVar32->mOffsetMatrix).b2 = 1.0;
              (paVar32->mOffsetMatrix).b3 = 0.0;
              (paVar32->mOffsetMatrix).b4 = 0.0;
              (paVar32->mOffsetMatrix).c1 = 0.0;
              (paVar32->mOffsetMatrix).c2 = 0.0;
              (paVar32->mOffsetMatrix).c3 = 1.0;
              (paVar32->mOffsetMatrix).c4 = 0.0;
              (paVar32->mOffsetMatrix).d1 = 0.0;
              (paVar32->mOffsetMatrix).d2 = 0.0;
              (paVar32->mOffsetMatrix).d3 = 0.0;
              (paVar32->mOffsetMatrix).d4 = 1.0;
              uVar39 = paVar26->mNumBones;
              paVar26->mNumBones = uVar39 + 1;
              paVar26->mBones[uVar39] = paVar32;
              uVar39 = (paVar4->mName).length;
              if (0x3fe < uVar39) {
                uVar39 = 0x3ff;
              }
              uVar37 = (ulong)uVar39;
              local_438[0].first = (aiMesh *)CONCAT44(local_438[0].first._4_4_,uVar39);
              memcpy((void *)((long)&local_438[0].first + 4),(paVar4->mName).data,uVar37);
              *(undefined1 *)((long)&local_438[0].first + uVar37 + 4) = 0;
              (paVar32->mName).length = uVar39;
              memcpy(local_478,(void *)((long)&local_438[0].first + 4),uVar37);
              __src = local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              (paVar32->mName).data[uVar37] = '\0';
              uVar37 = (ulong)((long)local_498.
                                     super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_498.
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3;
              uVar39 = (uint)uVar37;
              paVar32->mNumWeights = uVar39;
              fVar9 = (paVar4->mOffsetMatrix).a2;
              fVar10 = (paVar4->mOffsetMatrix).a3;
              fVar11 = (paVar4->mOffsetMatrix).a4;
              fVar12 = (paVar4->mOffsetMatrix).b1;
              fVar13 = (paVar4->mOffsetMatrix).b2;
              fVar14 = (paVar4->mOffsetMatrix).b3;
              fVar15 = (paVar4->mOffsetMatrix).b4;
              fVar16 = (paVar4->mOffsetMatrix).c1;
              fVar17 = (paVar4->mOffsetMatrix).c2;
              fVar18 = (paVar4->mOffsetMatrix).c3;
              fVar19 = (paVar4->mOffsetMatrix).c4;
              fVar20 = (paVar4->mOffsetMatrix).d1;
              fVar21 = (paVar4->mOffsetMatrix).d2;
              fVar22 = (paVar4->mOffsetMatrix).d3;
              fVar23 = (paVar4->mOffsetMatrix).d4;
              (paVar32->mOffsetMatrix).a1 = (paVar4->mOffsetMatrix).a1;
              (paVar32->mOffsetMatrix).a2 = fVar9;
              (paVar32->mOffsetMatrix).a3 = fVar10;
              (paVar32->mOffsetMatrix).a4 = fVar11;
              (paVar32->mOffsetMatrix).b1 = fVar12;
              (paVar32->mOffsetMatrix).b2 = fVar13;
              (paVar32->mOffsetMatrix).b3 = fVar14;
              (paVar32->mOffsetMatrix).b4 = fVar15;
              (paVar32->mOffsetMatrix).c1 = fVar16;
              (paVar32->mOffsetMatrix).c2 = fVar17;
              (paVar32->mOffsetMatrix).c3 = fVar18;
              (paVar32->mOffsetMatrix).c4 = fVar19;
              (paVar32->mOffsetMatrix).d1 = fVar20;
              (paVar32->mOffsetMatrix).d2 = fVar21;
              (paVar32->mOffsetMatrix).d3 = fVar22;
              (paVar32->mOffsetMatrix).d4 = fVar23;
              if (uVar25 == (uint)local_460) {
                paVar32->mWeights = paVar4->mWeights;
                paVar4->mWeights = (aiVertexWeight *)0x0;
              }
              else {
                uVar37 = (uVar37 & 0xffffffff) << 3;
                paVar33 = (aiVertexWeight *)operator_new__(uVar37);
                if (uVar39 != 0) {
                  memset(paVar33,0,uVar37);
                }
                paVar32->mWeights = paVar33;
              }
              memcpy(paVar32->mWeights,__src,(ulong)paVar32->mNumWeights << 3);
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 < paVar26->mNumBones);
        }
        if (local_498.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
            super__Vector_impl_data._M_start != (aiVertexWeight *)0x0) {
          operator_delete(local_498.
                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_498.
                                super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_498.
                                super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (paVar26->mNumFaces != 0) {
        uVar41 = 0;
        uVar39 = 0;
        do {
          paVar26->mFaces[uVar41].mNumIndices = 3;
          uVar24 = (int)local_470 + (int)uVar41;
          uVar36 = pMesh->mFaces[uVar24].mNumIndices;
          uVar37 = (ulong)uVar36;
          paVar26->mFaces[uVar41].mNumIndices = uVar36;
          puVar6 = pMesh->mFaces[uVar24].mIndices;
          puVar34 = (uint *)operator_new__(uVar37 * 4);
          paVar26->mFaces[uVar41].mIndices = puVar34;
          uVar24 = 8;
          if (uVar36 - 1 < 3) {
            uVar24 = *(uint *)(&DAT_006d8a74 + (ulong)(uVar36 - 1) * 4);
          }
          paVar26->mPrimitiveTypes = uVar24 | paVar26->mPrimitiveTypes;
          if (uVar37 != 0) {
            uVar38 = 0;
            uVar36 = uVar39;
            do {
              uVar24 = puVar6[uVar38];
              puVar34[uVar38] = uVar36;
              paVar29 = pMesh->mVertices;
              if (paVar29 != (aiVector3D *)0x0) {
                paVar7 = *local_458;
                paVar7[uVar36].z = paVar29[uVar24].z;
                fVar9 = paVar29[uVar24].y;
                paVar7 = paVar7 + uVar36;
                paVar7->x = paVar29[uVar24].x;
                paVar7->y = fVar9;
              }
              paVar29 = pMesh->mNormals;
              if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                paVar7 = paVar26->mNormals;
                paVar7[uVar36].z = paVar29[uVar24].z;
                fVar9 = paVar29[uVar24].y;
                paVar7 = paVar7 + uVar36;
                paVar7->x = paVar29[uVar24].x;
                paVar7->y = fVar9;
              }
              paVar29 = pMesh->mTangents;
              if (((paVar29 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
                 (pMesh->mNumVertices != 0)) {
                paVar7 = paVar26->mTangents;
                paVar7[uVar36].z = paVar29[uVar24].z;
                fVar9 = paVar29[uVar24].y;
                paVar7 = paVar7 + uVar36;
                paVar7->x = paVar29[uVar24].x;
                paVar7->y = fVar9;
                paVar29 = pMesh->mBitangents;
                paVar7 = paVar26->mBitangents;
                paVar7[uVar36].z = paVar29[uVar24].z;
                paVar29 = paVar29 + uVar24;
                fVar9 = paVar29->y;
                paVar7 = paVar7 + uVar36;
                paVar7->x = paVar29->x;
                paVar7->y = fVar9;
              }
              uVar39 = uVar36 + 1;
              lVar40 = 0;
              do {
                if ((pMesh->mTextureCoords[lVar40] != (aiVector3D *)0x0) &&
                   (pMesh->mNumVertices != 0)) {
                  paVar29 = pMesh->mTextureCoords[lVar40];
                  paVar7 = paVar26->mTextureCoords[lVar40];
                  paVar7[uVar36].z = paVar29[uVar24].z;
                  paVar29 = paVar29 + uVar24;
                  fVar9 = paVar29->y;
                  paVar7 = paVar7 + uVar36;
                  paVar7->x = paVar29->x;
                  paVar7->y = fVar9;
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 != 8);
              lVar40 = 0;
              do {
                if ((pMesh->mColors[lVar40] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                  paVar30 = pMesh->mColors[lVar40] + uVar24;
                  fVar9 = paVar30->g;
                  fVar10 = paVar30->b;
                  fVar11 = paVar30->a;
                  paVar2 = paVar26->mColors[lVar40] + uVar36;
                  paVar2->r = paVar30->r;
                  paVar2->g = fVar9;
                  paVar2->b = fVar10;
                  paVar2->a = fVar11;
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 != 8);
              uVar38 = uVar38 + 1;
              uVar36 = uVar39;
            } while (uVar38 != uVar37);
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 < paVar26->mNumFaces);
      }
      local_438[0].second = local_464;
      iVar8._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_448 + 8);
      local_438[0].first = paVar26;
      if (iVar8._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_448 + 0x10)) {
        std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
        ::_M_realloc_insert<std::pair<aiMesh*,unsigned_int>>(local_448,iVar8,local_438);
      }
      else {
        (iVar8._M_current)->first = paVar26;
        *(ulong *)&(iVar8._M_current)->second = CONCAT44(local_438[0]._12_4_,local_464);
        *(long *)(local_448 + 8) = *(long *)(local_448 + 8) + 0x10;
      }
      uVar25 = uVar25 + 1;
      local_480 = local_480 + uVar35;
    } while (uVar25 < local_47c);
    if (pMesh != (aiMesh *)0x0) {
      aiMesh::~aiMesh(pMesh);
      operator_delete(pMesh,0x520);
    }
  }
  else {
    iVar8._M_current =
         (avList->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (avList->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_438[0].first = pMesh;
      local_438[0].second = a;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)avList,iVar8,local_438);
    }
    else {
      (iVar8._M_current)->first = pMesh;
      *(ulong *)&(iVar8._M_current)->second = CONCAT44(local_438[0]._12_4_,a);
      pppVar3 = &(avList->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar3 = *pppVar3 + 1;
    }
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumFaces > SplitLargeMeshesProcess_Triangle::LIMIT) {
        ASSIMP_LOG_INFO("Mesh exceeds the triangle limit. It will be split ...");

        // we need to split this mesh into sub meshes
        // determine the size of a submesh
        const unsigned int iSubMeshes = (pMesh->mNumFaces / LIMIT) + 1;

        const unsigned int iOutFaceNum = pMesh->mNumFaces / iSubMeshes;
        const unsigned int iOutVertexNum = iOutFaceNum * 3;

        // now generate all submeshes
        for (unsigned int i = 0; i < iSubMeshes;++i) {
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumFaces       = iOutFaceNum;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            if (i == iSubMeshes-1) {
                pcMesh->mNumFaces = iOutFaceNum + (
                    pMesh->mNumFaces - iOutFaceNum * iSubMeshes);
            }
            // copy the list of faces
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            const unsigned int iBase = iOutFaceNum * i;

            // get the total number of indices
            unsigned int iCnt = 0;
            for (unsigned int p = iBase; p < pcMesh->mNumFaces + iBase;++p) {
                iCnt += pMesh->mFaces[p].mNumIndices;
            }
            pcMesh->mNumVertices = iCnt;

            // allocate storage
            if (pMesh->mVertices != nullptr) {
                pcMesh->mVertices = new aiVector3D[iCnt];
            }

            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iCnt];
            }

            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iCnt];
                pcMesh->mBitangents = new aiVector3D[iCnt];
            }

            // texture coordinates
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                if (pMesh->HasTextureCoords( c)) {
                    pcMesh->mTextureCoords[c] = new aiVector3D[iCnt];
                }
            }

            // vertex colors
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                if (pMesh->HasVertexColors( c)) {
                    pcMesh->mColors[c] = new aiColor4D[iCnt];
                }
            }

            if (pMesh->HasBones()) {
                // assume the number of bones won't change in most cases
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];

                // iterate through all bones of the mesh and find those which
                // need to be copied to the split mesh
                std::vector<aiVertexWeight> avTempWeights;
                for (unsigned int p = 0; p < pcMesh->mNumBones;++p) {
                    aiBone* const bone = pcMesh->mBones[p];
                    avTempWeights.clear();
                    avTempWeights.reserve(bone->mNumWeights / iSubMeshes);

                    for (unsigned int q = 0; q < bone->mNumWeights;++q) {
                        aiVertexWeight& weight = bone->mWeights[q];
                        if(weight.mVertexId >= iBase && weight.mVertexId < iBase + iOutVertexNum) {
                            avTempWeights.push_back(weight);
                            weight = avTempWeights.back();
                            weight.mVertexId -= iBase;
                        }
                    }

                    if (!avTempWeights.empty()) {
                        // we'll need this bone. Copy it ...
                        aiBone* pc = new aiBone();
                        pcMesh->mBones[pcMesh->mNumBones++] = pc;
                        pc->mName = aiString(bone->mName);
                        pc->mNumWeights = (unsigned int)avTempWeights.size();
                        pc->mOffsetMatrix = bone->mOffsetMatrix;

                        // no need to reallocate the array for the last submesh.
                        // Here we can reuse the (large) source array, although
                        // we'll waste some memory
                        if (iSubMeshes-1 == i) {
                            pc->mWeights = bone->mWeights;
                            bone->mWeights = nullptr;
                        } else {
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                        }

                        // copy the weights
                        ::memcpy(pc->mWeights,&avTempWeights[0],sizeof(aiVertexWeight)*pc->mNumWeights);
                    }
                }
            }

            // (we will also need to copy the array of indices)
            unsigned int iCurrent = 0;
            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p].mNumIndices = 3;
                // allocate a new array
                const unsigned int iTemp = p + iBase;
                const unsigned int iNumIndices = pMesh->mFaces[iTemp].mNumIndices;

                // setup face type and number of indices
                pcMesh->mFaces[p].mNumIndices = iNumIndices;
                unsigned int* pi = pMesh->mFaces[iTemp].mIndices;
                unsigned int* piOut = pcMesh->mFaces[p].mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (iNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pi[v];
                    unsigned int iIndexOut = iCurrent++;
                    piOut[v] = iIndexOut;

                    // copy positions
                    if (pMesh->mVertices != nullptr) {
                        pcMesh->mVertices[iIndexOut] = pMesh->mVertices[iIndex];
                    }

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[iIndexOut] = pMesh->mNormals[iIndex];
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[iIndexOut] = pMesh->mTangents[iIndex];
                        pcMesh->mBitangents[iIndexOut] = pMesh->mBitangents[iIndex];
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c ) ) {
                            pcMesh->mTextureCoords[c][iIndexOut] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][iIndexOut] = pMesh->mColors[c][iIndex];
                        }
                    }
                }
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));
        }

        // now delete the old mesh data
        delete pMesh;
    } else {
        avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
    }
}